

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void google::AddLogSink(LogSink *destination)

{
  iterator __position;
  vector<google::LogSink*,std::allocator<google::LogSink*>> *pvVar1;
  int iVar2;
  LogSink *local_10;
  
  local_10 = destination;
  iVar2 = pthread_rwlock_wrlock((pthread_rwlock_t *)LogDestination::sink_mutex_);
  if (iVar2 != 0x23) {
    if (LogDestination::sinks_ == (vector<google::LogSink*,std::allocator<google::LogSink*>> *)0x0)
    {
      LogDestination::sinks_ =
           (vector<google::LogSink*,std::allocator<google::LogSink*>> *)operator_new(0x18);
      *(undefined8 *)LogDestination::sinks_ = 0;
      *(undefined8 *)(LogDestination::sinks_ + 8) = 0;
      *(undefined8 *)(LogDestination::sinks_ + 0x10) = 0;
    }
    pvVar1 = LogDestination::sinks_;
    __position._M_current = *(LogSink ***)(LogDestination::sinks_ + 8);
    if (__position._M_current == *(LogSink ***)(LogDestination::sinks_ + 0x10)) {
      std::vector<google::LogSink*,std::allocator<google::LogSink*>>::
      _M_realloc_insert<google::LogSink*const&>(LogDestination::sinks_,__position,&local_10);
    }
    else {
      *__position._M_current = local_10;
      *(long *)(pvVar1 + 8) = *(long *)(pvVar1 + 8) + 8;
    }
    pthread_rwlock_unlock((pthread_rwlock_t *)LogDestination::sink_mutex_);
    return;
  }
  std::__throw_system_error(0x23);
}

Assistant:

void AddLogSink(LogSink* destination) {
  LogDestination::AddLogSink(destination);
}